

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmaincn.h
# Opt level: O0

void __thiscall
CVmMainClientConsole::display_error
          (CVmMainClientConsole *this,vm_globals *vmg,CVmException *exc,char *msg,int add_blank_line
          )

{
  uint uVar1;
  int iVar2;
  char *p;
  char *in_RCX;
  int in_R8D;
  int old_obey;
  int has_nl;
  size_t len;
  CVmConsole *con;
  vm_nl_type in_stack_ffffffffffffffbc;
  vm_nl_type nl;
  byte bVar3;
  uint in_stack_ffffffffffffffc0;
  CVmConsoleMain *this_00;
  
  p = (char *)strlen(in_RCX);
  nl = in_stack_ffffffffffffffbc & 0xffffff;
  if (p != (char *)0x0) {
    nl = CONCAT13(in_RCX[(long)(p + -1)] == '\n',(int3)in_stack_ffffffffffffffbc);
  }
  bVar3 = (byte)(nl >> 0x18);
  uVar1 = (uint)bVar3;
  if (G_console_X == (CVmConsoleMain *)0x0) {
    os_printz((char *)(ulong)CONCAT14(bVar3,in_stack_ffffffffffffffc0));
    if ((in_R8D != 0) && (os_printz((char *)CONCAT44(uVar1,in_stack_ffffffffffffffc0)), uVar1 == 0))
    {
      os_printz((char *)(ulong)in_stack_ffffffffffffffc0);
    }
  }
  else {
    this_00 = G_console_X;
    CVmConsole::flush((CVmConsole *)(ulong)CONCAT14(bVar3,in_stack_ffffffffffffffc0),nl);
    iVar2 = CVmConsole::set_obey_whitespace
                      ((CVmConsole *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),nl);
    CVmConsole::format_text(&this_00->super_CVmConsole,p);
    if (in_R8D != 0) {
      CVmConsole::write_blank_line((CVmConsole *)CONCAT44(uVar1,iVar2));
    }
    CVmConsole::set_obey_whitespace((CVmConsole *)CONCAT44(uVar1,iVar2),nl);
  }
  return;
}

Assistant:

void display_error(struct vm_globals *vmg, const struct CVmException *exc,
                       const char *msg, int add_blank_line)
    {
        CVmConsole *con;
        size_t len;

        /* check for a newline at the end of the message */
        int has_nl = ((len = strlen(msg)) != 0 && msg[len-1] == '\n');
        
        /* set up for global access */
        VMGLOB_PTR(vmg);

        /* if we have globals, get the console */
        con = VMGLOB_IF_AVAIL(G_console);
            
        /* if we have a console, write to it */
        if (con != 0)
        {
            int old_obey;
            
            /* flush any pending buffered output */
            con->flush(vmg_ VM_NL_NONE);

            /* put the console in obey-whitespace mode for our message */
            old_obey = con->set_obey_whitespace(TRUE);

            /* display the message on the console */
            con->format_text(vmg_ msg);

            /* add a blank line if desired */
            if (add_blank_line)
                con->write_blank_line(vmg0_);

            /* restore console mode */
            con->set_obey_whitespace(old_obey);
        }
        else
        {
            /* display the error on the OS-level console */
            os_printz(msg);

            /* add a blank line if desired */
            if (add_blank_line)
            {
                /* add one newline */
                os_printz("\n");

                /* 
                 *   if the message itself didn't end with a newline, add
                 *   another newline 
                 */
                if (!has_nl)
                    os_printz("\n");
            }
        }
    }